

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetFloatConst(ConstantManager *this,float val)

{
  Type *type;
  IRContext *this_00;
  TypeManager *this_01;
  Constant *pCVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  Constant *c;
  Type *pTStack_20;
  FloatProxy<float> v;
  Type *float_type;
  float val_local;
  ConstantManager *this_local;
  
  this_00 = context(this);
  this_01 = IRContext::get_type_mgr(this_00);
  pTStack_20 = TypeManager::GetFloatType(this_01);
  utils::FloatProxy<float>::FloatProxy((FloatProxy<float> *)((long)&c + 4),val);
  type = pTStack_20;
  utils::FloatProxy<float>::GetWords(&local_48,(FloatProxy<float> *)((long)&c + 4));
  pCVar1 = GetConstant(this,type,&local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetFloatConst(float val) {
  Type* float_type = context()->get_type_mgr()->GetFloatType();
  utils::FloatProxy<float> v(val);
  const Constant* c = GetConstant(float_type, v.GetWords());
  return c;
}